

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *
tinyusdz::lerp<tinyusdz::value::color4f>
          (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *a,
          vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *b,double t)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pcVar6;
  pointer pcVar7;
  ulong uVar8;
  long lVar9;
  ulong __new_size;
  float fVar10;
  float fVar11;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = (long)(a->
                super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4;
  if (uVar8 <= __new_size) {
    __new_size = uVar8;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      fVar10 = (float)(1.0 - t);
      fVar11 = (float)t;
      lVar9 = 8;
      do {
        pcVar6 = (a->
                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar7 = (b->
                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(undefined8 *)((long)pcVar6 + lVar9 + -8);
        uVar3 = *(undefined8 *)((long)&pcVar6->r + lVar9);
        uVar4 = *(undefined8 *)((long)pcVar7 + lVar9 + -8);
        uVar5 = *(undefined8 *)((long)&pcVar7->r + lVar9);
        pfVar1 = (float *)((long)(__return_storage_ptr__->
                                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
        *pfVar1 = (float)uVar4 * fVar11 + (float)uVar2 * fVar10;
        pfVar1[1] = (float)((ulong)uVar4 >> 0x20) * fVar11 + (float)((ulong)uVar2 >> 0x20) * fVar10;
        pfVar1[2] = (float)uVar5 * fVar11 + (float)uVar3 * fVar10;
        pfVar1[3] = (float)((ulong)uVar5 >> 0x20) * fVar11 + (float)((ulong)uVar3 >> 0x20) * fVar10;
        lVar9 = lVar9 + 0x10;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}